

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifunn(bifcxdef *ctx,int argc)

{
  ushort uVar1;
  runsdef *val;
  long lVar2;
  undefined4 in_ESI;
  vocddef *in_RDI;
  voccxdef *unaff_retaddr;
  voccxdef *voc;
  prpnum prop;
  objnum objn;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  val = *(runsdef **)(*(long *)&in_RDI->vocdarg + 0x70);
  lVar2 = *(long *)(*(long *)&in_RDI->vocdarg + 0x20);
  *(long *)(*(long *)&in_RDI->vocdarg + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)**(undefined8 **)&in_RDI->vocdarg + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
            in_stack_ffffffffffffffdc);
  }
  uVar1 = *(ushort *)(*(long *)(*(long *)&in_RDI->vocdarg + 0x20) + 8);
  lVar2 = *(long *)(*(long *)&in_RDI->vocdarg + 0x20);
  *(long *)(*(long *)&in_RDI->vocdarg + 0x20) = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\r') {
    *(undefined4 *)(*(long *)**(undefined8 **)&in_RDI->vocdarg + 0x68) = 0;
    runsign((runcxdef *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  vocremfd(unaff_retaddr,in_RDI,(objnum)((uint)in_ESI >> 0x10),(prpnum)in_ESI,val,(uint)uVar1);
  return;
}

Assistant:

void bifunn(bifcxdef *ctx, int argc)
{
    objnum    objn;
    prpnum    prop;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 2, argc);
    objn = runpopobj(ctx->bifcxrun);
    prop = runpopprp(ctx->bifcxrun);
    vocremfd(voc, voc->voccxalm, objn, prop,
             (runsdef *)0, ERR_NONFY);
}